

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_table_info.cpp
# Opt level: O2

unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> __thiscall
duckdb::CreateTableInfo::Copy(CreateTableInfo *this)

{
  unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *puVar1;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var2;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var3;
  type other;
  pointer pCVar4;
  pointer pCVar5;
  pointer pSVar6;
  pointer *__ptr;
  CreateInfo *in_RSI;
  unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *this_00;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> local_b8;
  _Head_base<0UL,_duckdb::CreateTableInfo_*,_false> local_b0;
  __uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_> local_a8;
  ColumnList local_a0;
  
  local_a8._M_t.
  super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
  super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl =
       (tuple<duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>)
       (tuple<duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>)this;
  make_uniq<duckdb::CreateTableInfo,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
            ((duckdb *)&local_b0,&in_RSI->catalog,&in_RSI->schema,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 1));
  other = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
          operator*((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                     *)&local_b0);
  CreateInfo::CopyProperties(in_RSI,&other->super_CreateInfo);
  ColumnList::Copy(&local_a0,(ColumnList *)&in_RSI[1].catalog.field_2);
  pCVar4 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_b0);
  ColumnList::operator=(&pCVar4->columns,&local_a0);
  ColumnList::~ColumnList(&local_a0);
  puVar1 = *(unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> **)
            &in_RSI[1].dependencies.set._M_h._M_rehash_policy;
  for (this_00 = (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
                 in_RSI[1].dependencies.set._M_h._M_element_count; this_00 != puVar1;
      this_00 = this_00 + 1) {
    pCVar4 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                           *)&local_b0);
    pCVar5 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
             operator->(this_00);
    (*pCVar5->_vptr_Constraint[3])(&local_a0,pCVar5);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
                *)&pCVar4->constraints,
               (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
               &local_a0);
    if (local_a0.columns.
        super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
        super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(((local_a0.columns.
                     super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                     .
                     super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                     ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p + 8))();
    }
  }
  if (in_RSI[1].dependencies.set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
    pSVar6 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
             ::operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                           *)&in_RSI[1].dependencies.set._M_h._M_single_bucket);
    (*(pSVar6->super_SQLStatement)._vptr_SQLStatement[3])(&local_b8,pSVar6);
    _Var3._M_head_impl = local_b8._M_head_impl;
    local_b8._M_head_impl = (SelectStatement *)0x0;
    pCVar4 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                           *)&local_b0);
    _Var2._M_head_impl =
         (pCVar4->query).
         super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
         .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
    (pCVar4->query).
    super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t.
    super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
    .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl = _Var3._M_head_impl;
    if (_Var2._M_head_impl != (SelectStatement *)0x0) {
      (**(code **)(*(long *)&(_Var2._M_head_impl)->super_SQLStatement + 8))();
    }
    if (local_b8._M_head_impl != (SelectStatement *)0x0) {
      (*((local_b8._M_head_impl)->super_SQLStatement)._vptr_SQLStatement[1])();
    }
  }
  *(CreateTableInfo **)
   local_a8._M_t.
   super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
   super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl = local_b0._M_head_impl;
  return (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)
         (_Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>)
         local_a8._M_t.
         super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
         super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<CreateInfo> CreateTableInfo::Copy() const {
	auto result = make_uniq<CreateTableInfo>(catalog, schema, table);
	CopyProperties(*result);
	result->columns = columns.Copy();
	for (auto &constraint : constraints) {
		result->constraints.push_back(constraint->Copy());
	}
	if (query) {
		result->query = unique_ptr_cast<SQLStatement, SelectStatement>(query->Copy());
	}
	return std::move(result);
}